

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getChessboardCorners
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *images,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *allFoundCorners,bool showResults)

{
  char cVar1;
  undefined7 in_register_00000011;
  pointer pMVar2;
  allocator<char> local_9d;
  undefined4 local_9c;
  _InputArray local_98;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *local_80;
  undefined4 local_78 [2];
  pointer local_70;
  undefined8 local_68;
  Size local_58;
  Size local_50;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> pointBuf;
  
  local_9c = (undefined4)CONCAT71(in_register_00000011,showResults);
  local_80 = allFoundCorners;
  for (pMVar2 = (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar2 != (images->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish; pMVar2 = pMVar2 + 0x60) {
    pointBuf.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pointBuf.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pointBuf.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = 0;
    local_78[0] = 0x1010000;
    local_98.sz.width = 0;
    local_98.sz.height = 0;
    local_50 = CHESSBOARD_DIMENSIONS;
    local_98.flags = -0x7dfcfff3;
    local_98.obj = (pointer)&pointBuf;
    local_70 = pMVar2;
    cVar1 = cv::findChessboardCorners((string *)local_78,&local_50,&local_98,3);
    if (cVar1 != '\0') {
      std::
      vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
      ::push_back(local_80,(value_type *)&pointBuf);
    }
    if ((char)local_9c != '\0') {
      local_68 = 0;
      local_78[0] = 0x3010000;
      local_98.sz.width = 0;
      local_98.sz.height = 0;
      local_58 = CHESSBOARD_DIMENSIONS;
      local_98.flags = -0x7efcfff3;
      local_98.obj = (pointer)&pointBuf;
      local_70 = pMVar2;
      cv::drawChessboardCorners((string *)local_78,&local_58,&local_98,cVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_78,"Searching for Corners...",&local_9d);
      local_98.sz.width = 0;
      local_98.sz.height = 0;
      local_98.flags = 0x1010000;
      local_98.obj = pMVar2;
      cv::imshow((string *)local_78,&local_98);
      std::__cxx11::string::~string((string *)local_78);
    }
    std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
              ((_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&pointBuf);
  }
  return;
}

Assistant:

void getChessboardCorners(std::vector<cv::Mat> images, std::vector<std::vector<cv::Point2f>>& allFoundCorners, bool showResults = false)
{
    for (std::vector<cv::Mat>::iterator iter = images.begin(); iter != images.end(); iter++) {
        std::vector<cv::Point2f> pointBuf;
        bool found = findChessboardCorners(*iter, CHESSBOARD_DIMENSIONS, pointBuf, cv::CALIB_CB_ADAPTIVE_THRESH | cv::CALIB_CB_NORMALIZE_IMAGE);
        if (found) 
        {
            allFoundCorners.push_back(pointBuf);
        }
        if (showResults)
        {
            drawChessboardCorners(*iter, CHESSBOARD_DIMENSIONS, pointBuf, found);
            imshow("Searching for Corners...", *iter);
        }
    }
}